

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::RaceSuccessfulPromiseNode<int>::RaceSuccessfulPromiseNode
          (RaceSuccessfulPromiseNode<int> *this,
          Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> promises,
          SourceLocation location)

{
  undefined8 *in_RSI;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_28;
  
  (this->super_RaceSuccessfulPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0057c520;
  local_28.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)*in_RSI;
  local_28.size_ = in_RSI[1];
  local_28.disposer = (ArrayDisposer *)in_RSI[2];
  *in_RSI = 0;
  in_RSI[1] = 0;
  RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase
            (&this->super_RaceSuccessfulPromiseNodeBase,&local_28,
             &(this->output).super_ExceptionOrValue,(SourceLocation)promises);
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Array(&local_28);
  (this->super_RaceSuccessfulPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0057c520;
  (this->output).super_ExceptionOrValue.exception.ptr.isSet = false;
  (this->output).value.ptr.isSet = false;
  return;
}

Assistant:

RaceSuccessfulPromiseNode(Array<OwnPromiseNode> promises,
                            SourceLocation location)
      : RaceSuccessfulPromiseNodeBase(kj::mv(promises), output, location) {}